

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmem_allocator.h
# Opt level: O2

void * __thiscall
cppcms::impl::
shmem_allocator<std::_List_node<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>::iterator>,_cppcms::impl::process_settings::process_memory>
::malloc(shmem_allocator<std::_List_node<cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,_cppcms::impl::string_hash,_cppcms::impl::string_equal,_cppcms::impl::shmem_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>,_cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,_cppcms::impl::process_settings::process_memory>_>::iterator>,_cppcms::impl::process_settings::process_memory>
         *this,size_t __size)

{
  void *pvVar1;
  
  pvVar1 = shmem_control::malloc(process_settings::process_memory,__size);
  return pvVar1;
}

Assistant:

void *malloc(size_t n) const
	{
		return mm->malloc(n);
	}